

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  uint uVar1;
  SectionTracker *pSVar2;
  pointer pIVar3;
  bool bVar4;
  SectionTracker *local_78 [3];
  NameAndLocation local_60;
  SectionTracker *local_30;
  ITracker *sectionTracker;
  Counts *assertions_local;
  SectionInfo *sectionInfo_local;
  RunContext *this_local;
  
  sectionTracker = (ITracker *)assertions;
  assertions_local = (Counts *)sectionInfo;
  sectionInfo_local = (SectionInfo *)this;
  TestCaseTracking::NameAndLocation::NameAndLocation
            (&local_60,&sectionInfo->name,&sectionInfo->lineInfo);
  pSVar2 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_60);
  TestCaseTracking::NameAndLocation::~NameAndLocation(&local_60);
  local_30 = pSVar2;
  uVar1 = (*(pSVar2->super_TrackerBase).super_ITracker._vptr_ITracker[4])();
  bVar4 = (uVar1 & 1) != 0;
  if (bVar4) {
    local_78[0] = local_30;
    clara::std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::push_back(&this->m_activeSections,(value_type *)local_78);
    (this->m_lastAssertionInfo).lineInfo.file = (char *)assertions_local[2].failedButOk;
    (this->m_lastAssertionInfo).lineInfo.line = assertions_local[3].passed;
    pIVar3 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->(&this->m_reporter);
    (*pIVar3->_vptr_IStreamingReporter[8])(pIVar3,assertions_local);
    sectionTracker->_vptr_ITracker = (_func_int **)(this->m_totals).assertions.passed;
    (sectionTracker->m_nameAndLocation).name._M_dataplus._M_p =
         (pointer)(this->m_totals).assertions.failed;
    (sectionTracker->m_nameAndLocation).name._M_string_length =
         (this->m_totals).assertions.failedButOk;
  }
  return bVar4;
}

Assistant:

bool RunContext::sectionStarted(SectionInfo const & sectionInfo, Counts & assertions) {
        ITracker& sectionTracker = SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(sectionInfo.name, sectionInfo.lineInfo));
        if (!sectionTracker.isOpen())
            return false;
        m_activeSections.push_back(&sectionTracker);

        m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

        m_reporter->sectionStarting(sectionInfo);

        assertions = m_totals.assertions;

        return true;
    }